

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

WasmSignature * __thiscall
Memory::AllocateArray<Memory::Recycler,Wasm::WasmSignature,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  WasmSignature *pWVar2;
  size_t byteSize;
  long lVar3;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pWVar2 = (WasmSignature *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x28),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x28),0);
    }
    pWVar2 = (WasmSignature *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    lVar3 = 0;
    do {
      Wasm::WasmSignature::WasmSignature((WasmSignature *)((long)&pWVar2->m_id + lVar3));
      lVar3 = lVar3 + 0x28;
    } while (count * 0x28 - lVar3 != 0);
  }
  return pWVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}